

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O2

bool __thiscall
cppcms::http::request::read_key_value
          (request *this,const_iterator *p,const_iterator e,string *key,string *value)

{
  byte bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var3;
  bool bVar4;
  string local_50;
  
  _Var2 = protocol::skip_ws<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (p->_M_current,e._M_current);
  p->_M_current = _Var2._M_current;
  _Var3 = protocol::tocken<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (_Var2,e._M_current);
  p->_M_current = _Var3._M_current;
  if (_Var3._M_current < e._M_current && _Var3._M_current == _Var2._M_current) {
LAB_001ff84c:
    (anonymous_namespace)::
    skip_after_period<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              (p,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )e._M_current);
LAB_001ff857:
    bVar4 = false;
  }
  else {
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)key,_Var2,_Var3);
    _Var2 = protocol::skip_ws<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                      (p->_M_current,e._M_current);
    p->_M_current = _Var2._M_current;
    bVar4 = true;
    if (e._M_current <= _Var2._M_current) {
      return true;
    }
    bVar1 = *_Var2._M_current;
    _Var3._M_current = (char *)(ulong)bVar1;
    if ((bVar1 == 0x3b) || (bVar1 == 0x2c)) {
      _Var2._M_current = _Var2._M_current + 1;
    }
    else {
      _Var2 = protocol::skip_ws<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (_Var2._M_current + 1,e._M_current);
      p->_M_current = _Var2._M_current;
      if (e._M_current <= _Var2._M_current) {
        return true;
      }
      if (*_Var2._M_current == '\"') {
        protocol::unquote<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  (&local_50,(protocol *)p,
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)e._M_current,_Var3);
        std::__cxx11::string::operator=((string *)value,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        _Var3._M_current = p->_M_current;
        if (_Var3._M_current == _Var2._M_current) {
          p->_M_current = (char *)e;
          goto LAB_001ff857;
        }
      }
      else {
        _Var3 = protocol::tocken<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                          (_Var2,e._M_current);
        p->_M_current = _Var3._M_current;
        std::__cxx11::string::
        assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                  ((string *)value,_Var2,_Var3);
        _Var3._M_current = p->_M_current;
        if (((_Var3._M_current == _Var2._M_current) && (*_Var3._M_current != ',')) &&
           (*_Var3._M_current != ';')) goto LAB_001ff84c;
      }
      _Var2 = protocol::skip_ws<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (_Var3,e._M_current);
      p->_M_current = _Var2._M_current;
      if (e._M_current <= _Var2._M_current) {
        return true;
      }
      if ((*_Var2._M_current != ';') && (*_Var2._M_current != ',')) {
        return true;
      }
      _Var2 = protocol::skip_ws<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        (_Var2._M_current + 1,e._M_current);
    }
    p->_M_current = _Var2._M_current;
  }
  return bVar4;
}

Assistant:

bool request::read_key_value(
		std::string::const_iterator &p,
		std::string::const_iterator e,
		std::string &key,
		std::string &value)
{
	std::string::const_iterator tmp;
	p=http::protocol::skip_ws(p,e);
	tmp=p;
	p=http::protocol::tocken(p,e);
	if(p==tmp && p<e) {
		skip_after_period(p,e);
		return false;
	}
	key.assign(tmp,p);
	p=http::protocol::skip_ws(p,e);
	if(p<e) {
		if(*p!='=') {
			if(*p==';' || *p==',') {
				++p;
				return true;
			}
		}
	}
	else {
		return true;
	}
	p=http::protocol::skip_ws(p+1,e);
	if(p < e) {
		if(*p=='"') {
			tmp=p;
			value=http::protocol::unquote(p,e);
			if(p==tmp) {
				p=e;
				return false;
			}
		}
		else {
			tmp=p;
			p=http::protocol::tocken(p,e);
			value.assign(tmp,p);
			if(p==tmp && p<e && *p!=';'&& *p!=',') {
				skip_after_period(p,e);
				return false;
			}
		}
	}
	else {
		return true;
	}
	p=http::protocol::skip_ws(p,e);
	if(p<e && (*p==';' || *p==',' ))
		p=http::protocol::skip_ws(p+1,e);
	return true;
}